

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O1

void YM2608_deltat_status_set(void *chip,UINT8 changebits)

{
  byte bVar1;
  YM2608 *F2608;
  
  bVar1 = changebits | *(byte *)((long)chip + 0x22f);
  *(byte *)((long)chip + 0x22f) = bVar1;
  if ((*(char *)((long)chip + 0x22d) == '\0') && ((*(byte *)((long)chip + 0x22e) & bVar1) != 0)) {
    *(undefined1 *)((long)chip + 0x22d) = 1;
    if (*(code **)((long)chip + 0x650) != (code *)0x0) {
      (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x210),1);
      return;
    }
  }
  return;
}

Assistant:

INLINE void FM_STATUS_SET(FM_ST *ST,int flag)
{
	/* set status flag */
	ST->status |= flag;
	if ( !(ST->irq) && (ST->status & ST->irqmask) )
	{
		ST->irq = 1;
		/* callback user interrupt handler (IRQ is OFF to ON) */
		if(ST->IRQ_Handler) (ST->IRQ_Handler)(ST->param,1);
	}
}